

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefUse.cpp
# Opt level: O1

bool __thiscall
dg::LLVMDefUseAnalysis::runOnNode(LLVMDefUseAnalysis *this,LLVMNode *node,LLVMNode *param_2)

{
  uint uVar1;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *pNVar2;
  LLVMDefUseAnalysis *this_00;
  long lVar3;
  LLVMNode *pLVar4;
  _Rb_tree_node_base *p_Var5;
  long *plVar6;
  Value *pVVar7;
  Value *pVVar8;
  LLVMNode *local_70;
  Value *local_68;
  LLVMNode *local_60;
  LLVMDefUseAnalysis *local_58;
  _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
  *local_50;
  Value *local_48;
  LLVMDependenceGraph *local_40;
  Value *local_38;
  
  local_68 = (node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).key;
  local_58 = this;
  if ((local_68 != (Value *)0x0) && (0x1a < (byte)local_68[0x10])) {
    uVar1 = *(uint *)(local_68 + 0x14);
    if ((uVar1 >> 0x1e & 1) == 0) {
      pVVar7 = local_68 + -(ulong)(uVar1 << 5);
    }
    else {
      pVVar7 = *(Value **)(local_68 + -8);
    }
    if ((uVar1 >> 0x1e & 1) == 0) {
      lVar3 = (long)local_68 - (ulong)(uVar1 << 5);
    }
    else {
      lVar3 = *(long *)(local_68 + -8);
    }
    pVVar8 = (Value *)((ulong)(uVar1 << 5) + lVar3);
    if (pVVar7 != pVVar8) {
      local_40 = (node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).dg;
      local_50 = (_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                  *)&(node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                     userEdges;
      local_48 = pVVar8;
      do {
        pLVar4 = DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
                           (&local_40->super_DependenceGraph<dg::LLVMNode>,*(Value **)pVVar7);
        if (pLVar4 != (LLVMNode *)0x0) {
          local_60 = pLVar4;
          local_38 = pVVar7;
          if (((pLVar4->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).subgraphs.
               _M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
             (*(char *)(*(long *)(pLVar4->
                                 super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                                 key + 8) != '\a')) {
            for (p_Var5 = (pLVar4->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>)
                          .subgraphs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var5 !=
                &(pLVar4->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                 subgraphs._M_t._M_impl.super__Rb_tree_header;
                p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
              local_70 = *(LLVMNode **)(*(long *)(p_Var5 + 1) + 0x20);
              pNVar2 = &local_70->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>;
              std::
              _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
              ::_M_insert_unique<dg::LLVMNode*const&>
                        ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                          *)&(node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>
                             ).revDataDepEdges,&local_70);
              local_70 = node;
              std::
              _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
              ::_M_insert_unique<dg::LLVMNode*const&>
                        ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                          *)&pNVar2->dataDepEdges,&local_70);
            }
          }
          pNVar2 = &local_60->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>;
          local_70 = local_60;
          std::
          _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
          ::_M_insert_unique<dg::LLVMNode*const&>(local_50,&local_70);
          local_70 = node;
          std::
          _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
          ::_M_insert_unique<dg::LLVMNode*const&>
                    ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                      *)&pNVar2->useEdges,&local_70);
          pVVar7 = local_38;
          pVVar8 = local_48;
        }
        pVVar7 = pVVar7 + 0x20;
      } while (pVVar7 != pVVar8);
    }
  }
  this_00 = local_58;
  plVar6 = (long *)dg::dda::LLVMDataDependenceAnalysis::getNode((Value *)local_58->RD);
  if ((plVar6 != (long *)0x0) &&
     (lVar3 = (**(code **)(*plVar6 + 0x18))(plVar6), *(long *)(lVar3 + 0x88) != 0)) {
    addDataDependencies(this_00,node);
  }
  return false;
}

Assistant:

bool LLVMDefUseAnalysis::runOnNode(LLVMNode *node, LLVMNode * /*prev*/) {
    Value *val = node->getKey();

    // just add direct def-use edges to every instruction
    if (auto *I = dyn_cast<Instruction>(val))
        handleOperands(I, node);

    if (RD->isUse(val)) {
        addDataDependencies(node);
    }

    // we will run only once
    return false;
}